

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
SkipWhitespaceAndComments<160u,rapidjson::BasicIStreamWrapper<std::istream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is)

{
  size_t sVar1;
  Ch *pCVar2;
  Ch CVar3;
  char *pcVar4;
  
LAB_0017d75b:
  do {
    SkipWhitespace<rapidjson::BasicIStreamWrapper<std::istream>>(is);
    if (*is->current_ != '/') {
      return;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    pcVar4 = is->current_;
    if (*pcVar4 == '*') {
      do {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        while( true ) {
          pcVar4 = is->current_;
          if (*pcVar4 != '*') break;
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          if (*is->current_ == '/') {
            BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
            goto LAB_0017d75b;
          }
        }
      } while (*pcVar4 != '\0');
LAB_0017d7df:
      sVar1 = is->count_;
      pCVar2 = is->buffer_;
      *(undefined4 *)(this + 0x30) = 0x11;
      *(char **)(this + 0x38) = pcVar4 + (sVar1 - (long)pCVar2);
      return;
    }
    if (*pcVar4 != '/') goto LAB_0017d7df;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    do {
      if (*is->current_ == '\0') break;
      CVar3 = BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    } while (CVar3 != '\n');
  } while( true );
}

Assistant:

void SkipWhitespaceAndComments(InputStream& is) {
        SkipWhitespace(is);

        if (parseFlags & kParseCommentsFlag) {
            while (RAPIDJSON_UNLIKELY(Consume(is, '/'))) {
                if (Consume(is, '*')) {
                    while (true) {
                        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
                            RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());
                        else if (Consume(is, '*')) {
                            if (Consume(is, '/'))
                                break;
                        }
                        else
                            is.Take();
                    }
                }
                else if (RAPIDJSON_LIKELY(Consume(is, '/')))
                    while (is.Peek() != '\0' && is.Take() != '\n') {}
                else
                    RAPIDJSON_PARSE_ERROR(kParseErrorUnspecificSyntaxError, is.Tell());

                SkipWhitespace(is);
            }
        }
    }